

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Compaction::~Compaction(Compaction *this)

{
  pointer ppFVar1;
  void *pvVar2;
  long lVar3;
  
  if (this->input_version_ != (Version *)0x0) {
    Version::Unref(this->input_version_);
  }
  ppFVar1 = (this->grandparents_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 != (pointer)0x0) {
    operator_delete(ppFVar1);
  }
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)&this->inputs_[1].
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x30);
  VersionEdit::~VersionEdit(&this->edit_);
  return;
}

Assistant:

Compaction::~Compaction() {
  if (input_version_ != nullptr) {
    input_version_->Unref();
  }
}